

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBox::setRootModelIndex(QComboBox *this,QModelIndex *index)

{
  bool bVar1;
  QAbstractItemView *pQVar2;
  QModelIndex *in_RSI;
  QComboBox *in_RDI;
  long in_FS_OFFSET;
  QComboBoxPrivate *d;
  QWidget *in_stack_ffffffffffffffc8;
  QPersistentModelIndex local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QComboBox *)0x5390df);
  bVar1 = ::operator==((QPersistentModelIndex *)in_RDI,(QModelIndex *)in_stack_ffffffffffffffc8);
  if (!bVar1) {
    QPersistentModelIndex::QPersistentModelIndex(&local_10,in_RSI);
    QPersistentModelIndex::operator=
              ((QPersistentModelIndex *)in_RDI,(QPersistentModelIndex *)in_stack_ffffffffffffffc8);
    QPersistentModelIndex::~QPersistentModelIndex(&local_10);
    pQVar2 = view(in_RDI);
    (**(code **)(*(long *)&(pQVar2->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x218))
              (pQVar2,in_RSI);
    QWidget::update(in_stack_ffffffffffffffc8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBox::setRootModelIndex(const QModelIndex &index)
{
    Q_D(QComboBox);
    if (d->root == index)
        return;
    d->root = QPersistentModelIndex(index);
    view()->setRootIndex(index);
    update();
}